

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSendBytes
               (HelicsEndpoint endpoint,void *data,int inputDataLength,HelicsError *err)

{
  EndpointObject *pEVar1;
  undefined8 extraout_RDX;
  int in_R8D;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    if (data != (void *)0x0 && 0 < inputDataLength) {
      helics::Endpoint::send
                (pEVar1->endPtr,(int)data,(void *)(ulong)(uint)inputDataLength,
                 CONCAT71((int7)((ulong)err >> 8),data != (void *)0x0),in_R8D);
    }
    else {
      local_38 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      local_30 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      local_28 = 0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::Endpoint::send
                (pEVar1->endPtr,(int)&local_38,
                 (void *)CONCAT71((int7)((ulong)extraout_RDX >> 8),0 < inputDataLength),
                 (size_t)gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,in_R8D);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
    }
  }
  return;
}

Assistant:

void helicsEndpointSendBytes(HelicsEndpoint endpoint, const void* data, int inputDataLength, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if ((data == nullptr) || (inputDataLength <= 0)) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(reinterpret_cast<const char*>(data), inputDataLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}